

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetacontainer.cpp
# Opt level: O1

void * __thiscall QMetaContainer::begin(QMetaContainer *this,void *container)

{
  QMetaContainerInterface *pQVar1;
  void *pvVar2;
  
  pQVar1 = this->d_ptr;
  if ((pQVar1 != (QMetaContainerInterface *)0x0) &&
     (pQVar1->createIteratorFn != (CreateIteratorFn)0x0)) {
    pvVar2 = (*pQVar1->createIteratorFn)(container,AtBegin);
    return pvVar2;
  }
  return (void *)0x0;
}

Assistant:

bool QMetaContainer::hasIterator() const
{
    if (!d_ptr || !d_ptr->createIteratorFn)
        return false;
    Q_ASSERT(d_ptr->destroyIteratorFn);
    Q_ASSERT(d_ptr->compareIteratorFn);
    Q_ASSERT(d_ptr->copyIteratorFn);
    Q_ASSERT(d_ptr->advanceIteratorFn);
    Q_ASSERT(d_ptr->diffIteratorFn);
    return true;
}